

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnndomain * rnn_finddomain(rnndb *db,char *name)

{
  int iVar1;
  int local_24;
  int i;
  char *name_local;
  rnndb *db_local;
  
  local_24 = 0;
  while( true ) {
    if (db->domainsnum <= local_24) {
      return (rnndomain *)0x0;
    }
    iVar1 = strcmp(db->domains[local_24]->name,name);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return db->domains[local_24];
}

Assistant:

struct rnndomain *rnn_finddomain (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->domainsnum; i++)
		if (!strcmp(db->domains[i]->name, name))
			return db->domains[i];
	return 0;
}